

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O2

vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *
detectFaces(vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__return_storage_ptr__,
           Mat *gray)

{
  allocator<char> local_59;
  CascadeClassifier facesCascade;
  undefined4 local_48 [2];
  Mat *local_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_20;
  
  cv::CascadeClassifier::CascadeClassifier(&facesCascade);
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,
             "/usr/local/share/opencv4/haarcascades/haarcascade_frontalface_default.xml",&local_59);
  cv::CascadeClassifier::load((string *)&facesCascade);
  std::__cxx11::string::~string((string *)local_48);
  local_38 = 0;
  local_48[0] = 0x1010000;
  local_20 = 0x1e0000001e;
  local_28 = 0;
  local_40 = gray;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,&facesCascade,local_48,__return_storage_ptr__,2,2,&local_20,&local_28);
  cv::CascadeClassifier::~CascadeClassifier(&facesCascade);
  return __return_storage_ptr__;
}

Assistant:

vector<Rect> detectFaces(Mat gray) {
  CascadeClassifier facesCascade;
  vector<Rect> faces;
  facesCascade.load(
      "/usr/local/share/opencv4/haarcascades/"
      "haarcascade_frontalface_default.xml");
  facesCascade.detectMultiScale(gray, faces, 1.1, 2, 0 | CASCADE_SCALE_IMAGE,
                                Size(30, 30));
  return faces;
}